

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O3

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  long lVar1;
  Curl_tree *pCVar2;
  int iVar3;
  undefined4 uVar4;
  Curl_tree *pCVar5;
  Curl_tree *pCVar6;
  Curl_tree *pCVar7;
  
  if (t == (Curl_tree *)0x0) {
    pCVar7 = (Curl_tree *)0x0;
    pCVar6 = (Curl_tree *)0x0;
  }
  else {
    pCVar5 = Curl_splay((curltime)ZEXT816(0),t);
    lVar1 = (pCVar5->key).tv_sec;
    pCVar6 = pCVar5;
    pCVar7 = (Curl_tree *)0x0;
    if (lVar1 <= i.tv_sec) {
      if ((lVar1 < i.tv_sec) || ((pCVar5->key).tv_usec <= i.tv_usec)) {
        pCVar6 = pCVar5->samen;
        pCVar7 = pCVar5;
        if (pCVar6 == pCVar5) {
          pCVar6 = pCVar5->larger;
        }
        else {
          iVar3 = (pCVar5->key).tv_usec;
          uVar4 = *(undefined4 *)&(pCVar5->key).field_0xc;
          (pCVar6->key).tv_sec = (pCVar5->key).tv_sec;
          (pCVar6->key).tv_usec = iVar3;
          *(undefined4 *)&(pCVar6->key).field_0xc = uVar4;
          pCVar2 = pCVar5->larger;
          pCVar6->smaller = pCVar5->smaller;
          pCVar6->larger = pCVar2;
          pCVar5 = pCVar5->samep;
          pCVar6->samep = pCVar5;
          pCVar5->samen = pCVar6;
        }
      }
      else {
        pCVar7 = (Curl_tree *)0x0;
      }
    }
  }
  *removed = pCVar7;
  return pCVar6;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}